

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readOpcode(InternalInstruction *insn)

{
  byte bVar1;
  int iVar2;
  uint8_t local_19;
  InternalInstruction *pIStack_18;
  uint8_t current;
  InternalInstruction *insn_local;
  
  insn->opcodeType = ONEBYTE;
  pIStack_18 = insn;
  if (insn->vectorExtensionType == TYPE_EVEX) {
    bVar1 = insn->vectorExtensionPrefix[1] & 3;
    if (bVar1 == 1) {
      insn->opcodeType = TWOBYTE;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else if (bVar1 == 2) {
      insn->opcodeType = THREEBYTE_38;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else if (bVar1 == 3) {
      insn->opcodeType = THREEBYTE_3A;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else {
      insn_local._4_4_ = -1;
    }
  }
  else if (insn->vectorExtensionType == TYPE_VEX_3B) {
    bVar1 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar1 == 1) {
      insn->twoByteEscape = '\x0f';
      insn->opcodeType = TWOBYTE;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else if (bVar1 == 2) {
      insn->twoByteEscape = '\x0f';
      insn->threeByteEscape = '8';
      insn->opcodeType = THREEBYTE_38;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else if (bVar1 == 3) {
      insn->twoByteEscape = '\x0f';
      insn->threeByteEscape = ':';
      insn->opcodeType = THREEBYTE_3A;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else {
      insn_local._4_4_ = -1;
    }
  }
  else if (insn->vectorExtensionType == TYPE_VEX_2B) {
    insn->twoByteEscape = '\x0f';
    insn->opcodeType = TWOBYTE;
    insn_local._4_4_ = consumeByte(insn,&insn->opcode);
  }
  else if (insn->vectorExtensionType == TYPE_XOP) {
    bVar1 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar1 == 8) {
      insn->opcodeType = XOP8_MAP;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else if (bVar1 == 9) {
      insn->opcodeType = XOP9_MAP;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else if (bVar1 == 10) {
      insn->opcodeType = XOPA_MAP;
      insn_local._4_4_ = consumeByte(insn,&insn->opcode);
    }
    else {
      insn_local._4_4_ = -1;
    }
  }
  else {
    iVar2 = consumeByte(insn,&local_19);
    if (iVar2 == 0) {
      pIStack_18->firstByte = local_19;
      if (local_19 == '\x0f') {
        pIStack_18->twoByteEscape = '\x0f';
        iVar2 = consumeByte(pIStack_18,&local_19);
        if (iVar2 != 0) {
          return -1;
        }
        if (local_19 == '8') {
          pIStack_18->threeByteEscape = '8';
          iVar2 = consumeByte(pIStack_18,&local_19);
          if (iVar2 != 0) {
            return -1;
          }
          pIStack_18->opcodeType = THREEBYTE_38;
        }
        else if (local_19 == ':') {
          pIStack_18->threeByteEscape = ':';
          iVar2 = consumeByte(pIStack_18,&local_19);
          if (iVar2 != 0) {
            return -1;
          }
          pIStack_18->opcodeType = THREEBYTE_3A;
        }
        else if (local_19 == '\x0e') {
          pIStack_18->opcodeType = T3DNOW_MAP;
          pIStack_18->consumedModRM = true;
        }
        else if (local_19 == '\x0f') {
          iVar2 = readModRM(pIStack_18);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = consumeByte(pIStack_18,&local_19);
          if (iVar2 != 0) {
            return -1;
          }
          pIStack_18->opcodeType = T3DNOW_MAP;
        }
        else {
          pIStack_18->opcodeType = TWOBYTE;
        }
      }
      pIStack_18->opcode = local_19;
      insn_local._4_4_ = 0;
    }
    else {
      insn_local._4_4_ = -1;
    }
  }
  return insn_local._4_4_;
}

Assistant:

static int readOpcode(struct InternalInstruction *insn)
{
	/* Determine the length of the primary opcode */
	uint8_t current;

	// printf(">>> readOpcode() = %x\n", insn->readerCursor);

	insn->opcodeType = ONEBYTE;

	if (insn->vectorExtensionType == TYPE_EVEX) {
		switch (mmFromEVEX2of4(insn->vectorExtensionPrefix[1])) {
			default:
				// dbgprintf(insn, "Unhandled mm field for instruction (0x%hhx)",
				// 		mmFromEVEX2of4(insn->vectorExtensionPrefix[1]));
				return -1;
			case VEX_LOB_0F:
				insn->opcodeType = TWOBYTE;
				return consumeByte(insn, &insn->opcode);
			case VEX_LOB_0F38:
				insn->opcodeType = THREEBYTE_38;
				return consumeByte(insn, &insn->opcode);
			case VEX_LOB_0F3A:
				insn->opcodeType = THREEBYTE_3A;
				return consumeByte(insn, &insn->opcode);
		}
	} else if (insn->vectorExtensionType == TYPE_VEX_3B) {
		switch (mmmmmFromVEX2of3(insn->vectorExtensionPrefix[1])) {
			default:
				// dbgprintf(insn, "Unhandled m-mmmm field for instruction (0x%hhx)",
				//		mmmmmFromVEX2of3(insn->vectorExtensionPrefix[1]));
				return -1;
			case VEX_LOB_0F:
				insn->twoByteEscape = 0x0f;
				insn->opcodeType = TWOBYTE;
				return consumeByte(insn, &insn->opcode);
			case VEX_LOB_0F38:
				insn->twoByteEscape = 0x0f;
				insn->threeByteEscape = 0x38;
				insn->opcodeType = THREEBYTE_38;
				return consumeByte(insn, &insn->opcode);
			case VEX_LOB_0F3A:
				insn->twoByteEscape = 0x0f;
				insn->threeByteEscape = 0x3a;
				insn->opcodeType = THREEBYTE_3A;
				return consumeByte(insn, &insn->opcode);
		}
	} else if (insn->vectorExtensionType == TYPE_VEX_2B) {
		insn->twoByteEscape = 0x0f;
		insn->opcodeType = TWOBYTE;
		return consumeByte(insn, &insn->opcode);
	} else if (insn->vectorExtensionType == TYPE_XOP) {
		switch (mmmmmFromXOP2of3(insn->vectorExtensionPrefix[1])) {
			default:
				// dbgprintf(insn, "Unhandled m-mmmm field for instruction (0x%hhx)",
				// 		mmmmmFromVEX2of3(insn->vectorExtensionPrefix[1]));
				return -1;
			case XOP_MAP_SELECT_8:
				// FIXME: twoByteEscape?
				insn->opcodeType = XOP8_MAP;
				return consumeByte(insn, &insn->opcode);
			case XOP_MAP_SELECT_9:
				// FIXME: twoByteEscape?
				insn->opcodeType = XOP9_MAP;
				return consumeByte(insn, &insn->opcode);
			case XOP_MAP_SELECT_A:
				// FIXME: twoByteEscape?
				insn->opcodeType = XOPA_MAP;
				return consumeByte(insn, &insn->opcode);
		}
	}

	if (consumeByte(insn, &current))
		return -1;

	// save this first byte for MOVcr, MOVdr, MOVrc, MOVrd
	insn->firstByte = current;

	if (current == 0x0f) {
		// dbgprintf(insn, "Found a two-byte escape prefix (0x%hhx)", current);

		insn->twoByteEscape = current;

		if (consumeByte(insn, &current))
			return -1;

		if (current == 0x38) {
			// dbgprintf(insn, "Found a three-byte escape prefix (0x%hhx)", current);

			insn->threeByteEscape = current;

			if (consumeByte(insn, &current))
				return -1;

			insn->opcodeType = THREEBYTE_38;
		} else if (current == 0x3a) {
			// dbgprintf(insn, "Found a three-byte escape prefix (0x%hhx)", current);

			insn->threeByteEscape = current;

			if (consumeByte(insn, &current))
				return -1;

			insn->opcodeType = THREEBYTE_3A;
		} else {
#ifndef CAPSTONE_X86_REDUCE
			switch(current) {
				default:
					// dbgprintf(insn, "Didn't find a three-byte escape prefix");
					insn->opcodeType = TWOBYTE;
					break;
				case 0x0e:	// HACK for femms. to be handled properly in next version 3.x
					insn->opcodeType = T3DNOW_MAP;
					// this encode does not have ModRM
					insn->consumedModRM = true;
					break;
				case 0x0f:
					// 3DNow instruction has weird format: ModRM/SIB/displacement + opcode
					if (readModRM(insn))
						return -1;
					// next is 3DNow opcode
					if (consumeByte(insn, &current))
						return -1;
					insn->opcodeType = T3DNOW_MAP;
					break;
			}
#endif
		}
	}

	/*
	 * At this point we have consumed the full opcode.
	 * Anything we consume from here on must be unconsumed.
	 */

	insn->opcode = current;

	return 0;
}